

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterFieldValuePrinter
          (Printer *this,FieldDescriptor *field,FastFieldValuePrinter *printer)

{
  _Base_ptr p_Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_bool>
  pVar2;
  pair<const_google::protobuf::FieldDescriptor_*,_std::nullptr_t> local_20;
  
  if (printer != (FastFieldValuePrinter *)0x0 && field != (FieldDescriptor *)0x0) {
    local_20.second = (void *)0x0;
    local_20.first = field;
    pVar2 = std::
            _Rb_tree<google::protobuf::FieldDescriptor_const*,std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,std::_Select1st<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
            ::
            _M_emplace_unique<std::pair<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>>
                      ((_Rb_tree<google::protobuf::FieldDescriptor_const*,std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,std::_Select1st<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
                        *)&this->custom_printers_,&local_20);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p_Var1 = pVar2.first._M_node._M_node[1]._M_parent;
      pVar2.first._M_node._M_node[1]._M_parent = (_Base_ptr)printer;
      if (p_Var1 == (_Base_ptr)0x0) {
        return true;
      }
      (**(code **)(*(long *)p_Var1 + 8))();
      return true;
    }
  }
  return false;
}

Assistant:

bool TextFormat::Printer::RegisterFieldValuePrinter(
    const FieldDescriptor* field, const FastFieldValuePrinter* printer) {
  if (field == nullptr || printer == nullptr) {
    return false;
  }
  auto pair = custom_printers_.insert(std::make_pair(field, nullptr));
  if (pair.second) {
    pair.first->second.reset(printer);
    return true;
  } else {
    return false;
  }
}